

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall duckdb::Vector::Flatten(Vector *this,idx_t count)

{
  ValidityMask *this_00;
  PhysicalType PVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  int64_t *piVar4;
  int64_t increment;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  unsigned_long *puVar6;
  byte *pbVar7;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var8;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var9;
  pointer puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  byte bVar16;
  VectorBuffer *pVVar17;
  unsigned_long count_00;
  idx_t iVar18;
  idx_t iVar19;
  type pVVar20;
  TemplatedValidityData<unsigned_long> *pTVar21;
  unsigned_long uVar22;
  Vector *pVVar23;
  pointer pVVar24;
  pointer pVVar25;
  type pVVar26;
  pointer pVVar27;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar28;
  InternalException *pIVar29;
  data_ptr_t pdVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  _Head_base<0UL,_duckdb::VectorArrayBuffer_*,_false> _Var34;
  idx_t idx;
  pointer this_01;
  bool bVar35;
  int iVar42;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar86;
  int iVar91;
  undefined1 auVar87 [16];
  int iVar92;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  templated_unique_single_t child_vec;
  templated_unique_single_t normalified_buffer;
  templated_unique_single_t flattened_buffer;
  Vector other;
  idx_t local_118;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_110;
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  type local_f8;
  _Head_base<0UL,_duckdb::VectorArrayBuffer_*,_false> local_f0;
  undefined1 local_e8 [8];
  LogicalType aLStack_e0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<duckdb::VectorBuffer,_true> local_78;
  idx_t local_68;
  LogicalType local_60;
  LogicalType local_48;
  
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
  local_118 = count;
  switch(this->vector_type) {
  case FLAT_VECTOR:
    goto switchD_01311f38_caseD_0;
  case FSST_VECTOR:
    iVar18 = FSSTVector::GetCount(this);
    LogicalType::LogicalType(&local_48,&this->type);
    Vector((Vector *)local_e8,&local_48,iVar18);
    LogicalType::~LogicalType(&local_48);
    VectorOperations::Copy(this,(Vector *)local_e8,iVar18,0,0);
    Reference(this,(Vector *)local_e8);
    break;
  case CONSTANT_VECTOR:
    puVar6 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar6 == (unsigned_long *)0x0) {
      bVar35 = false;
    }
    else {
      bVar35 = (*puVar6 & 1) == 0;
    }
    local_78.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pbVar7 = this->data;
    iVar19 = GetTypeIdSize((this->type).physical_type_);
    iVar18 = 0x800;
    if (0x800 < count) {
      iVar18 = count;
    }
    local_108 = (undefined1  [8])(iVar19 * iVar18);
    make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)local_e8,(unsigned_long *)local_108);
    auVar14 = local_e8;
    uVar11 = aLStack_e0[0]._0_8_;
    _local_e8 = (undefined1  [16])0x0;
    p_Var5 = (this->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar14;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_);
    }
    if (local_78.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
      pVVar20 = shared_ptr<duckdb::VectorBuffer,_true>::operator*(&local_78);
      _Var8._M_head_impl =
           (pVVar20->aux_data).
           super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
      (pVVar20->aux_data).
      super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
           (VectorAuxiliaryData *)0x0;
      _Var9._M_head_impl =
           (pVVar17->aux_data).
           super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
      (pVVar17->aux_data).
      super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var8._M_head_impl
      ;
      if (_Var9._M_head_impl != (VectorAuxiliaryData *)0x0) {
        (**(code **)((long)(_Var9._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
      }
    }
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    this->data = (pVVar17->data).pointer;
    this->vector_type = FLAT_VECTOR;
    this_00 = &this->validity;
    if ((bool)((this->type).physical_type_ != ARRAY & bVar35)) {
      if ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        local_108 = (undefined1  [8])
                    (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_e8,(unsigned_long *)local_108);
        auVar14 = local_e8;
        uVar11 = aLStack_e0[0]._0_8_;
        _local_e8 = (undefined1  [16])0x0;
        p_Var5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)auVar14;
        (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_);
        }
        pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(this->validity).super_TemplatedValidityMask<unsigned_long>.
                              validity_data);
        (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar21->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      iVar18 = local_118;
      if ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        local_108 = (undefined1  [8])
                    (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_e8,(unsigned_long *)local_108);
        auVar14 = local_e8;
        uVar11 = aLStack_e0[0]._0_8_;
        _local_e8 = (undefined1  [16])0x0;
        p_Var5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)auVar14;
        (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_);
        }
        pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(this->validity).super_TemplatedValidityMask<unsigned_long>.
                              validity_data);
        (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar21->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      if (iVar18 != 0) {
        uVar32 = iVar18 + 0x3f >> 6;
        if (uVar32 != 1) {
          switchD_01306cb1::default
                    ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask,0,
                     uVar32 * 8 - 8);
        }
        uVar22 = -1L << ((byte)iVar18 & 0x3f);
        if ((iVar18 & 0x3f) == 0) {
          uVar22 = 0;
        }
        (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar32 - 1] = uVar22;
      }
      if ((this->type).physical_type_ != STRUCT) goto LAB_01313293;
    }
    auVar13 = _DAT_01dd7b40;
    PVar1 = (this->type).physical_type_;
    if (199 < PVar1) {
      if (PVar1 == VARCHAR) {
        if (local_118 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          uVar12 = *(undefined8 *)(pbVar7 + 8);
          pdVar30 = this->data + 8;
          iVar18 = local_118;
          do {
            *(undefined8 *)(pdVar30 + -8) = uVar11;
            *(undefined8 *)pdVar30 = uVar12;
            pdVar30 = pdVar30 + 0x10;
            iVar18 = iVar18 - 1;
          } while (iVar18 != 0);
        }
      }
      else if (PVar1 == UINT128) {
        if (local_118 != 0) {
          pdVar30 = this->data;
          uVar11 = *(undefined8 *)pbVar7;
          uVar12 = *(undefined8 *)(pbVar7 + 8);
          iVar18 = local_118;
          do {
            *(undefined8 *)pdVar30 = uVar11;
            *(undefined8 *)(pdVar30 + 8) = uVar12;
            pdVar30 = pdVar30 + 0x10;
            iVar18 = iVar18 - 1;
          } while (iVar18 != 0);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_0131237e_caseD_a;
        if (local_118 != 0) {
          pdVar30 = this->data;
          uVar11 = *(undefined8 *)pbVar7;
          uVar12 = *(undefined8 *)(pbVar7 + 8);
          iVar18 = local_118;
          do {
            *(undefined8 *)pdVar30 = uVar11;
            *(undefined8 *)(pdVar30 + 8) = uVar12;
            pdVar30 = pdVar30 + 0x10;
            iVar18 = iVar18 - 1;
          } while (iVar18 != 0);
        }
      }
      goto LAB_01313293;
    }
    switch(PVar1) {
    case BOOL:
      if (local_118 == 0) break;
      pdVar30 = this->data;
      bVar16 = *pbVar7 & 1;
      goto LAB_0131315f;
    case UINT8:
    case INT8:
      if (local_118 == 0) break;
      pdVar30 = this->data;
      bVar16 = *pbVar7;
LAB_0131315f:
      switchD_01306cb1::default(pdVar30,(uint)bVar16,local_118);
      break;
    case UINT16:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar2 = *(undefined2 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar39._8_4_ = (int)lVar31;
        auVar39._0_8_ = lVar31;
        auVar39._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar39 = auVar39 ^ _DAT_01dd7b40;
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar49 = _DAT_01dd8b80;
        auVar54 = _DAT_01dd8b90;
        auVar56 = _DAT_01dd8ba0;
        auVar58 = _DAT_01dd7b30;
        do {
          auVar62 = auVar58 ^ auVar13;
          iVar86 = auVar39._0_4_;
          iVar85 = -(uint)(iVar86 < auVar62._0_4_);
          iVar42 = auVar39._4_4_;
          auVar71._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar92 = auVar39._8_4_;
          iVar91 = -(uint)(iVar92 < auVar62._8_4_);
          iVar43 = auVar39._12_4_;
          auVar71._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar81._4_4_ = iVar85;
          auVar81._0_4_ = iVar85;
          auVar81._8_4_ = iVar91;
          auVar81._12_4_ = iVar91;
          auVar45 = pshuflw(in_XMM11,auVar81,0xe8);
          auVar70._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar70._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar59 = pshuflw(in_XMM12,auVar70,0xe8);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar62 = pshuflw(auVar45,auVar71,0xe8);
          auVar62 = (auVar62 | auVar59 & auVar45) ^ auVar61;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2) = uVar2;
          }
          auVar71 = auVar70 & auVar81 | auVar71;
          auVar62 = packssdw(auVar71,auVar71);
          auVar62 = packssdw(auVar62 ^ auVar61,auVar62 ^ auVar61);
          if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 2) = uVar2;
          }
          auVar62 = auVar56 ^ auVar13;
          iVar85 = -(uint)(iVar86 < auVar62._0_4_);
          auVar89._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar91 = -(uint)(iVar92 < auVar62._8_4_);
          auVar89._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar72._4_4_ = iVar85;
          auVar72._0_4_ = iVar85;
          auVar72._8_4_ = iVar91;
          auVar72._12_4_ = iVar91;
          auVar82._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar82._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar89._0_4_ = auVar89._4_4_;
          auVar89._8_4_ = auVar89._12_4_;
          auVar62 = auVar82 & auVar72 | auVar89;
          auVar62 = packssdw(auVar62,auVar62);
          auVar62 = packssdw(auVar62 ^ auVar61,auVar62 ^ auVar61);
          if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 4) = uVar2;
          }
          auVar66 = pshufhw(auVar72,auVar72,0x84);
          auVar78 = pshufhw(auVar82,auVar82,0x84);
          auVar44 = pshufhw(auVar66,auVar89,0x84);
          auVar66 = (auVar44 | auVar78 & auVar66) ^ auVar61;
          auVar66 = packssdw(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 6) = uVar2;
          }
          auVar66 = auVar54 ^ auVar13;
          iVar85 = -(uint)(iVar86 < auVar66._0_4_);
          auVar74._4_4_ = -(uint)(iVar42 < auVar66._4_4_);
          iVar91 = -(uint)(iVar92 < auVar66._8_4_);
          auVar74._12_4_ = -(uint)(iVar43 < auVar66._12_4_);
          auVar83._4_4_ = iVar85;
          auVar83._0_4_ = iVar85;
          auVar83._8_4_ = iVar91;
          auVar83._12_4_ = iVar91;
          auVar62 = pshuflw(auVar62,auVar83,0xe8);
          auVar73._4_4_ = -(uint)(auVar66._4_4_ == iVar42);
          auVar73._12_4_ = -(uint)(auVar66._12_4_ == iVar43);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          in_XMM12 = pshuflw(auVar59 & auVar45,auVar73,0xe8);
          in_XMM12 = in_XMM12 & auVar62;
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar62 = pshuflw(auVar62,auVar74,0xe8);
          auVar62 = (auVar62 | in_XMM12) ^ auVar61;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 8) = uVar2;
          }
          auVar74 = auVar73 & auVar83 | auVar74;
          auVar62 = packssdw(auVar74,auVar74);
          auVar62 = packssdw(auVar62 ^ auVar61,auVar62 ^ auVar61);
          if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 10) = uVar2;
          }
          auVar62 = auVar49 ^ auVar13;
          iVar86 = -(uint)(iVar86 < auVar62._0_4_);
          auVar90._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar92 = -(uint)(iVar92 < auVar62._8_4_);
          auVar90._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar75._4_4_ = iVar86;
          auVar75._0_4_ = iVar86;
          auVar75._8_4_ = iVar92;
          auVar75._12_4_ = iVar92;
          auVar84._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar84._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar84._0_4_ = auVar84._4_4_;
          auVar84._8_4_ = auVar84._12_4_;
          auVar90._0_4_ = auVar90._4_4_;
          auVar90._8_4_ = auVar90._12_4_;
          auVar62 = auVar84 & auVar75 | auVar90;
          auVar62 = packssdw(auVar62,auVar62);
          in_XMM11 = packssdw(auVar62 ^ auVar61,auVar62 ^ auVar61);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 0xc) = uVar2;
          }
          auVar62 = pshufhw(auVar75,auVar75,0x84);
          auVar59 = pshufhw(auVar84,auVar84,0x84);
          auVar45 = pshufhw(auVar62,auVar90,0x84);
          auVar62 = (auVar45 | auVar59 & auVar62) ^ auVar61;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 0xe) = uVar2;
          }
          uVar32 = uVar32 + 8;
          lVar31 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + 8;
          auVar58._8_8_ = lVar31 + 8;
          lVar31 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + 8;
          auVar56._8_8_ = lVar31 + 8;
          lVar31 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 8;
          auVar54._8_8_ = lVar31 + 8;
          lVar31 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 8;
          auVar49._8_8_ = lVar31 + 8;
        } while ((local_118 + 7 & 0xfffffffffffffff8) != uVar32);
      }
      break;
    case INT16:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar2 = *(undefined2 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar38._8_4_ = (int)lVar31;
        auVar38._0_8_ = lVar31;
        auVar38._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar38 = auVar38 ^ _DAT_01dd7b40;
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar48 = _DAT_01dd8b80;
        auVar53 = _DAT_01dd8b90;
        auVar55 = _DAT_01dd8ba0;
        auVar57 = _DAT_01dd7b30;
        do {
          auVar62 = auVar57 ^ auVar13;
          iVar86 = auVar38._0_4_;
          iVar85 = -(uint)(iVar86 < auVar62._0_4_);
          iVar42 = auVar38._4_4_;
          auVar64._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar92 = auVar38._8_4_;
          iVar91 = -(uint)(iVar92 < auVar62._8_4_);
          iVar43 = auVar38._12_4_;
          auVar64._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar76._4_4_ = iVar85;
          auVar76._0_4_ = iVar85;
          auVar76._8_4_ = iVar91;
          auVar76._12_4_ = iVar91;
          auVar45 = pshuflw(in_XMM11,auVar76,0xe8);
          auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar59 = pshuflw(in_XMM12,auVar63,0xe8);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar62 = pshuflw(auVar45,auVar64,0xe8);
          auVar62 = (auVar62 | auVar59 & auVar45) ^ auVar60;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2) = uVar2;
          }
          auVar64 = auVar63 & auVar76 | auVar64;
          auVar62 = packssdw(auVar64,auVar64);
          auVar62 = packssdw(auVar62 ^ auVar60,auVar62 ^ auVar60);
          if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 2) = uVar2;
          }
          auVar62 = auVar55 ^ auVar13;
          iVar85 = -(uint)(iVar86 < auVar62._0_4_);
          auVar87._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar91 = -(uint)(iVar92 < auVar62._8_4_);
          auVar87._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar65._4_4_ = iVar85;
          auVar65._0_4_ = iVar85;
          auVar65._8_4_ = iVar91;
          auVar65._12_4_ = iVar91;
          auVar77._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar77._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar87._0_4_ = auVar87._4_4_;
          auVar87._8_4_ = auVar87._12_4_;
          auVar62 = auVar77 & auVar65 | auVar87;
          auVar62 = packssdw(auVar62,auVar62);
          auVar62 = packssdw(auVar62 ^ auVar60,auVar62 ^ auVar60);
          if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 4) = uVar2;
          }
          auVar66 = pshufhw(auVar65,auVar65,0x84);
          auVar78 = pshufhw(auVar77,auVar77,0x84);
          auVar44 = pshufhw(auVar66,auVar87,0x84);
          auVar66 = (auVar44 | auVar78 & auVar66) ^ auVar60;
          auVar66 = packssdw(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 6) = uVar2;
          }
          auVar66 = auVar53 ^ auVar13;
          iVar85 = -(uint)(iVar86 < auVar66._0_4_);
          auVar68._4_4_ = -(uint)(iVar42 < auVar66._4_4_);
          iVar91 = -(uint)(iVar92 < auVar66._8_4_);
          auVar68._12_4_ = -(uint)(iVar43 < auVar66._12_4_);
          auVar79._4_4_ = iVar85;
          auVar79._0_4_ = iVar85;
          auVar79._8_4_ = iVar91;
          auVar79._12_4_ = iVar91;
          auVar62 = pshuflw(auVar62,auVar79,0xe8);
          auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar42);
          auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar43);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          in_XMM12 = pshuflw(auVar59 & auVar45,auVar67,0xe8);
          in_XMM12 = in_XMM12 & auVar62;
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar62 = pshuflw(auVar62,auVar68,0xe8);
          auVar62 = (auVar62 | in_XMM12) ^ auVar60;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 8) = uVar2;
          }
          auVar68 = auVar67 & auVar79 | auVar68;
          auVar62 = packssdw(auVar68,auVar68);
          auVar62 = packssdw(auVar62 ^ auVar60,auVar62 ^ auVar60);
          if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 10) = uVar2;
          }
          auVar62 = auVar48 ^ auVar13;
          iVar86 = -(uint)(iVar86 < auVar62._0_4_);
          auVar88._4_4_ = -(uint)(iVar42 < auVar62._4_4_);
          iVar92 = -(uint)(iVar92 < auVar62._8_4_);
          auVar88._12_4_ = -(uint)(iVar43 < auVar62._12_4_);
          auVar69._4_4_ = iVar86;
          auVar69._0_4_ = iVar86;
          auVar69._8_4_ = iVar92;
          auVar69._12_4_ = iVar92;
          auVar80._4_4_ = -(uint)(auVar62._4_4_ == iVar42);
          auVar80._12_4_ = -(uint)(auVar62._12_4_ == iVar43);
          auVar80._0_4_ = auVar80._4_4_;
          auVar80._8_4_ = auVar80._12_4_;
          auVar88._0_4_ = auVar88._4_4_;
          auVar88._8_4_ = auVar88._12_4_;
          auVar62 = auVar80 & auVar69 | auVar88;
          auVar62 = packssdw(auVar62,auVar62);
          in_XMM11 = packssdw(auVar62 ^ auVar60,auVar62 ^ auVar60);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 0xc) = uVar2;
          }
          auVar62 = pshufhw(auVar69,auVar69,0x84);
          auVar59 = pshufhw(auVar80,auVar80,0x84);
          auVar45 = pshufhw(auVar62,auVar88,0x84);
          auVar62 = (auVar45 | auVar59 & auVar62) ^ auVar60;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar30 + uVar32 * 2 + 0xe) = uVar2;
          }
          uVar32 = uVar32 + 8;
          lVar31 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + 8;
          auVar57._8_8_ = lVar31 + 8;
          lVar31 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + 8;
          auVar55._8_8_ = lVar31 + 8;
          lVar31 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 8;
          auVar53._8_8_ = lVar31 + 8;
          lVar31 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 8;
          auVar48._8_8_ = lVar31 + 8;
        } while ((local_118 + 7 & 0xfffffffffffffff8) != uVar32);
      }
      break;
    case UINT32:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar3 = *(undefined4 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar37._8_4_ = (int)lVar31;
        auVar37._0_8_ = lVar31;
        auVar37._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar37 = auVar37 ^ _DAT_01dd7b40;
        auVar47 = _DAT_01dd8ba0;
        auVar52 = _DAT_01dd7b30;
        do {
          auVar62 = auVar52 ^ auVar13;
          iVar86 = auVar37._4_4_;
          if ((bool)(~(auVar62._4_4_ == iVar86 && auVar37._0_4_ < auVar62._0_4_ ||
                      iVar86 < auVar62._4_4_) & 1)) {
            *(undefined4 *)(pdVar30 + uVar32 * 4) = uVar3;
          }
          if ((auVar62._12_4_ != auVar37._12_4_ || auVar62._8_4_ <= auVar37._8_4_) &&
              auVar62._12_4_ <= auVar37._12_4_) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 4) = uVar3;
          }
          iVar42 = SUB164(auVar47 ^ auVar13,4);
          if (iVar42 <= iVar86 && (iVar42 != iVar86 || SUB164(auVar47 ^ auVar13,0) <= auVar37._0_4_)
             ) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 8) = uVar3;
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 0xc) = uVar3;
          }
          uVar32 = uVar32 + 4;
          lVar31 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 4;
          auVar52._8_8_ = lVar31 + 4;
          lVar31 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 4;
          auVar47._8_8_ = lVar31 + 4;
        } while ((local_118 + 3 & 0xfffffffffffffffc) != uVar32);
      }
      break;
    case INT32:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar3 = *(undefined4 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar36._8_4_ = (int)lVar31;
        auVar36._0_8_ = lVar31;
        auVar36._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar36 = auVar36 ^ _DAT_01dd7b40;
        auVar46 = _DAT_01dd8ba0;
        auVar51 = _DAT_01dd7b30;
        do {
          auVar62 = auVar51 ^ auVar13;
          iVar86 = auVar36._4_4_;
          if ((bool)(~(auVar62._4_4_ == iVar86 && auVar36._0_4_ < auVar62._0_4_ ||
                      iVar86 < auVar62._4_4_) & 1)) {
            *(undefined4 *)(pdVar30 + uVar32 * 4) = uVar3;
          }
          if ((auVar62._12_4_ != auVar36._12_4_ || auVar62._8_4_ <= auVar36._8_4_) &&
              auVar62._12_4_ <= auVar36._12_4_) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 4) = uVar3;
          }
          iVar42 = SUB164(auVar46 ^ auVar13,4);
          if (iVar42 <= iVar86 && (iVar42 != iVar86 || SUB164(auVar46 ^ auVar13,0) <= auVar36._0_4_)
             ) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 8) = uVar3;
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 0xc) = uVar3;
          }
          uVar32 = uVar32 + 4;
          lVar31 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + 4;
          auVar51._8_8_ = lVar31 + 4;
          lVar31 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 4;
          auVar46._8_8_ = lVar31 + 4;
        } while ((local_118 + 3 & 0xfffffffffffffffc) != uVar32);
      }
      break;
    case UINT64:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar11 = *(undefined8 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar41._8_4_ = (int)lVar31;
        auVar41._0_8_ = lVar31;
        auVar41._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar41 = auVar41 ^ _DAT_01dd7b40;
        auVar50 = _DAT_01dd7b30;
        do {
          auVar62 = auVar50 ^ auVar13;
          if ((bool)(~(auVar62._4_4_ == auVar41._4_4_ && auVar41._0_4_ < auVar62._0_4_ ||
                      auVar41._4_4_ < auVar62._4_4_) & 1)) {
            *(undefined8 *)(pdVar30 + uVar32 * 8) = uVar11;
          }
          if ((auVar62._12_4_ != auVar41._12_4_ || auVar62._8_4_ <= auVar41._8_4_) &&
              auVar62._12_4_ <= auVar41._12_4_) {
            *(undefined8 *)(pdVar30 + uVar32 * 8 + 8) = uVar11;
          }
          uVar32 = uVar32 + 2;
          lVar31 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 2;
          auVar50._8_8_ = lVar31 + 2;
        } while ((local_118 + 1 & 0xfffffffffffffffe) != uVar32);
      }
      break;
    case INT64:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar11 = *(undefined8 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar40._8_4_ = (int)lVar31;
        auVar40._0_8_ = lVar31;
        auVar40._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar40 = auVar40 ^ _DAT_01dd7b40;
        auVar78 = _DAT_01dd7b30;
        do {
          auVar62 = auVar78 ^ auVar13;
          if ((bool)(~(auVar62._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar62._0_4_ ||
                      auVar40._4_4_ < auVar62._4_4_) & 1)) {
            *(undefined8 *)(pdVar30 + uVar32 * 8) = uVar11;
          }
          if ((auVar62._12_4_ != auVar40._12_4_ || auVar62._8_4_ <= auVar40._8_4_) &&
              auVar62._12_4_ <= auVar40._12_4_) {
            *(undefined8 *)(pdVar30 + uVar32 * 8 + 8) = uVar11;
          }
          uVar32 = uVar32 + 2;
          lVar31 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 2;
          auVar78._8_8_ = lVar31 + 2;
        } while ((local_118 + 1 & 0xfffffffffffffffe) != uVar32);
      }
      break;
    default:
switchD_0131237e_caseD_a:
      pIVar29 = (InternalException *)__cxa_allocate_exception(0x10);
      local_e8 = (undefined1  [8])&aLStack_e0[0].type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"Unimplemented type for VectorOperations::Flatten","");
      InternalException::InternalException(pIVar29,(string *)local_e8);
      __cxa_throw(pIVar29,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar3 = *(undefined4 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar44._8_4_ = (int)lVar31;
        auVar44._0_8_ = lVar31;
        auVar44._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar44 = auVar44 ^ _DAT_01dd7b40;
        auVar59 = _DAT_01dd8ba0;
        auVar66 = _DAT_01dd7b30;
        do {
          auVar62 = auVar66 ^ auVar13;
          iVar86 = auVar44._4_4_;
          if ((bool)(~(auVar62._4_4_ == iVar86 && auVar44._0_4_ < auVar62._0_4_ ||
                      iVar86 < auVar62._4_4_) & 1)) {
            *(undefined4 *)(pdVar30 + uVar32 * 4) = uVar3;
          }
          if ((auVar62._12_4_ != auVar44._12_4_ || auVar62._8_4_ <= auVar44._8_4_) &&
              auVar62._12_4_ <= auVar44._12_4_) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 4) = uVar3;
          }
          iVar42 = SUB164(auVar59 ^ auVar13,4);
          if (iVar42 <= iVar86 && (iVar42 != iVar86 || SUB164(auVar59 ^ auVar13,0) <= auVar44._0_4_)
             ) {
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 8) = uVar3;
            *(undefined4 *)(pdVar30 + uVar32 * 4 + 0xc) = uVar3;
          }
          uVar32 = uVar32 + 4;
          lVar31 = auVar66._8_8_;
          auVar66._0_8_ = auVar66._0_8_ + 4;
          auVar66._8_8_ = lVar31 + 4;
          lVar31 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + 4;
          auVar59._8_8_ = lVar31 + 4;
        } while ((local_118 + 3 & 0xfffffffffffffffc) != uVar32);
      }
      break;
    case DOUBLE:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar11 = *(undefined8 *)pbVar7;
        lVar31 = local_118 - 1;
        auVar45._8_4_ = (int)lVar31;
        auVar45._0_8_ = lVar31;
        auVar45._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar45 = auVar45 ^ _DAT_01dd7b40;
        auVar62 = _DAT_01dd7b30;
        do {
          auVar59 = auVar62 ^ auVar13;
          if ((bool)(~(auVar59._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar59._0_4_ ||
                      auVar45._4_4_ < auVar59._4_4_) & 1)) {
            *(undefined8 *)(pdVar30 + uVar32 * 8) = uVar11;
          }
          if ((auVar59._12_4_ != auVar45._12_4_ || auVar59._8_4_ <= auVar45._8_4_) &&
              auVar59._12_4_ <= auVar45._12_4_) {
            *(undefined8 *)(pdVar30 + uVar32 * 8 + 8) = uVar11;
          }
          uVar32 = uVar32 + 2;
          lVar31 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + 2;
          auVar62._8_8_ = lVar31 + 2;
        } while ((local_118 + 1 & 0xfffffffffffffffe) != uVar32);
      }
      break;
    case INTERVAL:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar11 = *(undefined8 *)pbVar7;
        uVar12 = *(undefined8 *)(pbVar7 + 8);
        iVar18 = local_118;
        do {
          *(undefined8 *)pdVar30 = uVar11;
          *(undefined8 *)(pdVar30 + 8) = uVar12;
          pdVar30 = pdVar30 + 0x10;
          iVar18 = iVar18 - 1;
        } while (iVar18 != 0);
      }
      break;
    case LIST:
      if (local_118 != 0) {
        pdVar30 = this->data;
        uVar11 = *(undefined8 *)pbVar7;
        uVar12 = *(undefined8 *)(pbVar7 + 8);
        iVar18 = local_118;
        do {
          *(undefined8 *)pdVar30 = uVar11;
          *(undefined8 *)(pdVar30 + 8) = uVar12;
          pdVar30 = pdVar30 + 0x10;
          iVar18 = iVar18 - 1;
        } while (iVar18 != 0);
      }
      break;
    case STRUCT:
      make_uniq<duckdb::VectorStructBuffer>();
      pVVar27 = unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                              *)local_108);
      pvVar28 = StructVector::GetEntries(this);
      this_01 = (pvVar28->
                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (pvVar28->
                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 != puVar10) {
        do {
          pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_01);
          pVVar23 = (Vector *)operator_new(0x68);
          Vector(pVVar23,pVVar26);
          local_e8 = (undefined1  [8])pVVar23;
          pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                *)local_e8);
          Flatten(pVVar25,local_118);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                      *)&pVVar27->children,
                     (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     local_e8);
          if (local_e8 != (undefined1  [8])0x0) {
            ::std::default_delete<duckdb::Vector>::operator()
                      ((default_delete<duckdb::Vector> *)local_e8,(Vector *)local_e8);
          }
          this_01 = this_01 + 1;
        } while (this_01 != puVar10);
      }
      local_e8 = local_108;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = _Stack_100._M_pi;
      _local_108 = auVar13 << 0x40;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorStructBuffer*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                 (VectorStructBuffer *)local_e8);
      uVar11 = aLStack_e0[0]._0_8_;
      auVar14 = local_e8;
      _local_e8 = (undefined1  [16])0x0;
      p_Var5 = (this->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar14;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_);
      }
      _Var34._M_head_impl = (VectorArrayBuffer *)local_108;
      goto LAB_01312db6;
    case ARRAY:
      pVVar23 = ArrayVector::GetEntryInternal<duckdb::Vector>(this);
      iVar18 = ArrayType::GetSize(&this->type);
      make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&,unsigned_long&>
                ((duckdb *)&local_f0,&this->type,&local_118);
      pVVar24 = unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                ::operator->((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                              *)&local_f0);
      local_f8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (&pVVar24->child);
      if (bVar35) {
        TemplatedValidityMask<unsigned_long>::SetAllInvalid
                  (&this_00->super_TemplatedValidityMask<unsigned_long>,local_118);
        TemplatedValidityMask<unsigned_long>::SetAllInvalid
                  (&(local_f8->validity).super_TemplatedValidityMask<unsigned_long>,
                   local_118 * iVar18);
        Flatten(local_f8,local_118 * iVar18);
      }
      make_uniq<duckdb::Vector,duckdb::Vector&>((duckdb *)&local_110,pVVar23);
      pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_110);
      Flatten(pVVar25,local_118 * iVar18);
      SelectionVector::SelectionVector((SelectionVector *)local_e8,local_118 * iVar18);
      if (local_118 != 0) {
        iVar19 = 0;
        uVar32 = 0;
        local_68 = iVar18;
        do {
          if (local_68 != 0) {
            uVar33 = 0;
            iVar18 = local_68;
            idx = iVar19;
            do {
              pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                   *)&local_110);
              puVar6 = (pVVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if ((puVar6 != (unsigned_long *)0x0) &&
                 ((puVar6[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0)) {
                FlatVector::SetNull(local_f8,idx,true);
              }
              *(int *)((long)local_e8 + idx * 4) = (int)uVar33;
              uVar33 = uVar33 + 1;
              idx = idx + 1;
              iVar18 = iVar18 - 1;
            } while (iVar18 != 0);
          }
          uVar32 = uVar32 + 1;
          iVar19 = iVar19 + local_68;
          iVar18 = local_68;
        } while (uVar32 < local_118);
      }
      pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_110);
      VectorOperations::Copy(pVVar26,local_f8,(SelectionVector *)local_e8,local_118 * iVar18,0,0);
      _Var34._M_head_impl = local_f0._M_head_impl;
      local_f0._M_head_impl = (VectorArrayBuffer *)0x0;
      local_108 = (undefined1  [8])_Var34._M_head_impl;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorArrayBuffer*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),_Var34._M_head_impl);
      _Var15._M_pi = _Stack_100._M_pi;
      auVar14 = local_108;
      _local_108 = (undefined1  [16])0x0;
      p_Var5 = (this->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar14;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var15._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
      }
      if (aLStack_e0[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   aLStack_e0[0].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      _Var34._M_head_impl = local_f0._M_head_impl;
      if (local_110._M_head_impl != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_110,local_110._M_head_impl);
        _Var34._M_head_impl = local_f0._M_head_impl;
      }
LAB_01312db6:
      if ((__uniq_ptr_impl<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
           )_Var34._M_head_impl !=
          (__uniq_ptr_impl<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
           )0x0) {
        (**(code **)(*(long *)_Var34._M_head_impl + 8))();
      }
    }
LAB_01313293:
    if (local_78.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return;
  case DICTIONARY_VECTOR:
    LogicalType::LogicalType(&local_60,&this->type);
    Vector((Vector *)local_e8,&local_60,local_118);
    LogicalType::~LogicalType(&local_60);
    VectorOperations::Copy(this,(Vector *)local_e8,local_118,0,0);
    Reference(this,(Vector *)local_e8);
    break;
  case SEQUENCE_VECTOR:
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    piVar4 = (int64_t *)(pVVar17->data).pointer;
    local_f8 = (type)*piVar4;
    increment = piVar4[1];
    count_00 = NumericCastImpl<unsigned_long,_long,_false>::Convert(piVar4[2]);
    uVar22 = 0x800;
    if (0x800 < count_00) {
      uVar22 = count_00;
    }
    iVar18 = GetTypeIdSize((this->type).physical_type_);
    local_78.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(iVar18 * uVar22);
    make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)local_e8,(unsigned_long *)&local_78);
    auVar14 = local_e8;
    uVar11 = aLStack_e0[0]._0_8_;
    _local_e8 = (undefined1  [16])0x0;
    p_Var5 = (this->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar14;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_e0[0]._0_8_);
    }
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    this->data = (pVVar17->data).pointer;
    VectorOperations::GenerateSequence(this,count_00,(int64_t)local_f8,increment);
    return;
  default:
    pIVar29 = (InternalException *)__cxa_allocate_exception(0x10);
    local_e8 = (undefined1  [8])&aLStack_e0[0].type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Unimplemented type for normalify","");
    InternalException::InternalException(pIVar29,(string *)local_e8);
    __cxa_throw(pIVar29,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
  }
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)(local_e8 + 8));
switchD_01311f38_caseD_0:
  return;
}

Assistant:

void Vector::Flatten(idx_t count) {
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		// already a flat vector
		break;
	case VectorType::FSST_VECTOR: {
		// Even though count may only be a part of the vector, we need to flatten the whole thing due to the way
		// ToUnifiedFormat uses flatten
		idx_t total_count = FSSTVector::GetCount(*this);
		// create vector to decompress into
		Vector other(GetType(), total_count);
		// now copy the data of this vector to the other vector, decompressing the strings in the process
		VectorOperations::Copy(*this, other, total_count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::DICTIONARY_VECTOR: {
		// create a new flat vector of this type
		Vector other(GetType(), count);
		// now copy the data of this vector to the other vector, removing the selection vector in the process
		VectorOperations::Copy(*this, other, count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::CONSTANT_VECTOR: {
		bool is_null = ConstantVector::IsNull(*this);
		// allocate a new buffer for the vector
		auto old_buffer = std::move(buffer);
		auto old_data = data;
		buffer = VectorBuffer::CreateStandardVector(type, MaxValue<idx_t>(STANDARD_VECTOR_SIZE, count));
		if (old_buffer) {
			D_ASSERT(buffer->GetAuxiliaryData() == nullptr);
			// The old buffer might be relying on the auxiliary data, keep it alive
			buffer->MoveAuxiliaryData(*old_buffer);
		}
		data = buffer->GetData();
		vector_type = VectorType::FLAT_VECTOR;
		if (is_null && GetType().InternalType() != PhysicalType::ARRAY) {
			// constant NULL, set nullmask
			validity.EnsureWritable();
			validity.SetAllInvalid(count);
			if (GetType().InternalType() != PhysicalType::STRUCT) {
				// for structs we still need to flatten the child vectors as well
				return;
			}
		}
		// non-null constant: have to repeat the constant
		switch (GetType().InternalType()) {
		case PhysicalType::BOOL:
			TemplatedFlattenConstantVector<bool>(data, old_data, count);
			break;
		case PhysicalType::INT8:
			TemplatedFlattenConstantVector<int8_t>(data, old_data, count);
			break;
		case PhysicalType::INT16:
			TemplatedFlattenConstantVector<int16_t>(data, old_data, count);
			break;
		case PhysicalType::INT32:
			TemplatedFlattenConstantVector<int32_t>(data, old_data, count);
			break;
		case PhysicalType::INT64:
			TemplatedFlattenConstantVector<int64_t>(data, old_data, count);
			break;
		case PhysicalType::UINT8:
			TemplatedFlattenConstantVector<uint8_t>(data, old_data, count);
			break;
		case PhysicalType::UINT16:
			TemplatedFlattenConstantVector<uint16_t>(data, old_data, count);
			break;
		case PhysicalType::UINT32:
			TemplatedFlattenConstantVector<uint32_t>(data, old_data, count);
			break;
		case PhysicalType::UINT64:
			TemplatedFlattenConstantVector<uint64_t>(data, old_data, count);
			break;
		case PhysicalType::INT128:
			TemplatedFlattenConstantVector<hugeint_t>(data, old_data, count);
			break;
		case PhysicalType::UINT128:
			TemplatedFlattenConstantVector<uhugeint_t>(data, old_data, count);
			break;
		case PhysicalType::FLOAT:
			TemplatedFlattenConstantVector<float>(data, old_data, count);
			break;
		case PhysicalType::DOUBLE:
			TemplatedFlattenConstantVector<double>(data, old_data, count);
			break;
		case PhysicalType::INTERVAL:
			TemplatedFlattenConstantVector<interval_t>(data, old_data, count);
			break;
		case PhysicalType::VARCHAR:
			TemplatedFlattenConstantVector<string_t>(data, old_data, count);
			break;
		case PhysicalType::LIST: {
			TemplatedFlattenConstantVector<list_entry_t>(data, old_data, count);
			break;
		}
		case PhysicalType::ARRAY: {
			auto &original_child = ArrayVector::GetEntry(*this);
			auto array_size = ArrayType::GetSize(GetType());
			auto flattened_buffer = make_uniq<VectorArrayBuffer>(GetType(), count);
			auto &new_child = flattened_buffer->GetChild();

			// Fast path: The array is a constant null
			if (is_null) {
				// Invalidate the parent array
				validity.SetAllInvalid(count);
				// Also invalidate the new child array
				new_child.validity.SetAllInvalid(count * array_size);
				// Recurse
				new_child.Flatten(count * array_size);
				// TODO: the fast path should exit here, but the part below it is somehow required for correctness
				// Attach the flattened buffer and return
				// auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());
				// return;
			}

			// Now we need to "unpack" the child vector.
			// Basically, do this:
			//
			// | a1 | | 1 |      | a1 | | 1 |
			//        | 2 |      | a2 | | 2 |
			//	             =>    ..   | 1 |
			//                          | 2 |
			// 							 ...

			auto child_vec = make_uniq<Vector>(original_child);
			child_vec->Flatten(count * array_size);

			// Create a selection vector
			SelectionVector sel(count * array_size);
			for (idx_t array_idx = 0; array_idx < count; array_idx++) {
				for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
					auto position = array_idx * array_size + elem_idx;
					// Broadcast the validity
					if (FlatVector::IsNull(*child_vec, elem_idx)) {
						FlatVector::SetNull(new_child, position, true);
					}
					sel.set_index(position, elem_idx);
				}
			}

			// Copy over the data to the new buffer
			VectorOperations::Copy(*child_vec, new_child, sel, count * array_size, 0, 0);
			auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());

			break;
		}
		case PhysicalType::STRUCT: {
			auto normalified_buffer = make_uniq<VectorStructBuffer>();

			auto &new_children = normalified_buffer->GetChildren();

			auto &child_entries = StructVector::GetEntries(*this);
			for (auto &child : child_entries) {
				D_ASSERT(child->GetVectorType() == VectorType::CONSTANT_VECTOR);
				auto vector = make_uniq<Vector>(*child);
				vector->Flatten(count);
				new_children.push_back(std::move(vector));
			}
			auxiliary = shared_ptr<VectorBuffer>(normalified_buffer.release());
			break;
		}
		default:
			throw InternalException("Unimplemented type for VectorOperations::Flatten");
		}
		break;
	}
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment, sequence_count;
		SequenceVector::GetSequence(*this, start, increment, sequence_count);
		auto seq_count = NumericCast<idx_t>(sequence_count);

		buffer = VectorBuffer::CreateStandardVector(GetType(), MaxValue<idx_t>(STANDARD_VECTOR_SIZE, seq_count));
		data = buffer->GetData();
		VectorOperations::GenerateSequence(*this, seq_count, start, increment);
		break;
	}
	default:
		throw InternalException("Unimplemented type for normalify");
	}
}